

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teleport.c
# Opt level: O2

int dotele(void)

{
  uint uVar1;
  bool bVar2;
  char cVar3;
  boolean bVar4;
  schar sVar5;
  short sVar6;
  int iVar7;
  trap *trap;
  flag *pfVar8;
  undefined8 extraout_RDX;
  char *pcVar9;
  char *line;
  int iVar10;
  
  trap = t_at(level,(int)u.ux,(int)u.uy);
  if ((trap == (trap *)0x0) || ((trap->field_0x8 & 0x3f) != 0x30)) {
LAB_0024840e:
    if ((u.uprops[0xe].extrinsic != 0 || u.uprops[0xe].intrinsic != 0) ||
       (uVar1 = (youmonst.data)->mflags1, (uVar1 >> 0x19 & 1) != 0)) {
      pfVar8 = (flag *)(ulong)(urole.malenum != 0x168);
      iVar7 = 0;
      bVar2 = true;
      pcVar9 = "to teleport";
      if ((u.ulevel < (int)((uint)(urole.malenum != 0x168) * 4 + 8)) &&
         (uVar1 = (youmonst.data)->mflags1, (uVar1 >> 0x19 & 1) == 0)) goto LAB_0024847b;
    }
    else {
LAB_0024847b:
      iVar7 = 0;
      if (((objects[0x19f].field_0x10 & 1) != 0) && (u.uprops[0x1c].intrinsic == 0)) {
        iVar7 = 0x2b;
        for (pfVar8 = (flag *)0x0; pfVar8 != (flag *)0x2b; pfVar8 = (flag *)&pfVar8->autoquiver) {
          if (spl_book[(long)pfVar8].sp_id == 0x19f) {
            pcVar9 = "for a teleport spell";
            bVar2 = false;
            iVar7 = (int)pfVar8;
            goto LAB_002484fa;
          }
        }
      }
      pfVar8 = &flags;
      if (flags.debug == '\0') {
        if ((u.uprops[0xe].extrinsic != 0 || u.uprops[0xe].intrinsic != 0) ||
            (uVar1 >> 0x19 & 1) != 0) {
          pcVar9 = "You are not able to teleport at will.";
        }
        else {
          pcVar9 = "You don\'t know that spell.";
        }
        goto LAB_002486a9;
      }
      bVar2 = true;
      pcVar9 = "to teleport";
    }
LAB_002484fa:
    if (u.uhunger < 0x65) {
      if (flags.debug == '\0') {
LAB_002485aa:
        pcVar9 = "for a teleport spell";
        if (bVar2) {
          pcVar9 = "to teleport";
        }
        line = "You lack the strength %s.";
        goto LAB_002485c6;
      }
    }
    else {
      sVar5 = acurr(0);
      pfVar8 = (flag *)CONCAT71((int7)((ulong)extraout_RDX >> 8),
                                flags.debug != '\0' || '\x05' < sVar5);
      if (flags.debug == '\0' && '\x05' >= sVar5) goto LAB_002485aa;
    }
    sVar6 = objects[0x19f].oc_oc2 * 7;
    pfVar8 = (flag *)CONCAT62((int6)((ulong)pfVar8 >> 0x10),sVar6 % 2);
    iVar10 = (int)(short)(sVar6 / 2 + -2);
    if ((u.uen <= iVar10) && (iVar10 = u.uen, flags.debug == '\0')) {
      line = "You lack the energy %s.";
LAB_002485c6:
      pline(line,pcVar9,pfVar8);
      return 1;
    }
    bVar4 = check_capacity("Your concentration falters from carrying so much.");
    if (bVar4 != '\0') {
      return 1;
    }
    if (bVar2) {
      u.uen = u.uen - iVar10;
      iflags.botl = '\x01';
      bVar2 = true;
      trap = (trap *)0x0;
    }
    else {
      exercise(2,'\x01');
      iVar7 = spelleffects(iVar7,'\x01');
      if (iVar7 != 0) {
        return 1;
      }
      trap = (trap *)0x0;
      if (flags.debug == '\0') {
        return 0;
      }
      bVar2 = true;
    }
  }
  else {
    if ((trap->field_0x8 & 0x40) != 0) {
      pline("This is a vault teleport, usable once only.");
      cVar3 = yn_function("Jump in?","yn",'n');
      if (cVar3 == 'n') goto LAB_0024840e;
      deltrap(level,trap);
      newsym((int)u.ux,(int)u.uy);
    }
    pcVar9 = locomotion(youmonst.data,"jump");
    bVar2 = false;
    pline("You %s onto the teleportation trap.",pcVar9);
  }
  bVar4 = next_to_u();
  if (bVar4 != '\0') {
    if ((bVar2) || ((trap->field_0x8 & 0x40) == 0)) {
      iVar7 = tele((char *)0x0);
      if (iVar7 == 0) {
        return 0;
      }
    }
    else {
      vault_tele();
    }
    next_to_u();
    if (!bVar2) {
      return 1;
    }
    morehungry(100);
    return 1;
  }
  pcVar9 = "You shudder for a moment.";
LAB_002486a9:
  pline(pcVar9);
  return 0;
}

Assistant:

int dotele(void)
{
	struct trap *trap;

	trap = t_at(level, u.ux, u.uy);
	if (trap && (!trap->tseen || trap->ttyp != TELEP_TRAP))
		trap = 0;

	if (trap) {
		if (trap->once) {
			pline("This is a vault teleport, usable once only.");
			if (yn("Jump in?") == 'n')
				trap = 0;
			else {
				deltrap(level, trap);
				newsym(u.ux, u.uy);
			}
		}
		if (trap)
			pline("You %s onto the teleportation trap.",
			    locomotion(youmonst.data, "jump"));
	}
	if (!trap) {
	    boolean castit = FALSE;
	    int sp_no = 0, energy = 0;

	    if (!Teleportation || (u.ulevel < (Role_if (PM_WIZARD) ? 8 : 12)
					&& !can_teleport(youmonst.data))) {
		/* Try to use teleport away spell. */
		if (objects[SPE_TELEPORT_AWAY].oc_name_known && !Confusion)
		    for (sp_no = 0; sp_no < MAXSPELL; sp_no++)
			if (spl_book[sp_no].sp_id == SPE_TELEPORT_AWAY) {
				castit = TRUE;
				break;
			}
		if (!wizard) {
		    if (!castit) {
			if (!Teleportation)
			    pline("You don't know that spell.");
			else pline("You are not able to teleport at will.");
			return 0;
		    }
		}
	    }

	    if (u.uhunger <= 100 || ACURR(A_STR) < 6) {
		if (!wizard) {
			pline("You lack the strength %s.",
			    castit ? "for a teleport spell" : "to teleport");
			return 1;
		}
	    }

	    energy = objects[SPE_TELEPORT_AWAY].oc_level * 7 / 2 - 2;
	    if (u.uen <= energy) {
		if (wizard)
			energy = u.uen;
		else
		{
			pline("You lack the energy %s.",
			    castit ? "for a teleport spell" : "to teleport");
			return 1;
		}
	    }

	    if (check_capacity(
			"Your concentration falters from carrying so much."))
		return 1;

	    if (castit) {
		exercise(A_WIS, TRUE);
		if (spelleffects(sp_no, TRUE))
			return 1;
		else
		    if (!wizard)
			return 0;
	    } else {
		u.uen -= energy;
		iflags.botl = 1;
	    }
	}

	if (next_to_u()) {
		if (trap && trap->once) vault_tele();
		else if (!tele(NULL)) return 0;
		next_to_u();
	} else {
		pline("You shudder for a moment.");
		return 0;
	}
	if (!trap) morehungry(100);
	return 1;
}